

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void erase_suite::erase_range_wstring(void)

{
  index_type *this;
  bool v;
  type v_00;
  iterator local_d8;
  iterator local_c0;
  const_iterator local_a8;
  iterator local_80;
  const_iterator local_68;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  this = &where.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_80,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_68,&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_a8,&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::erase
            ((iterator *)local_50,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,&local_68,&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                ((iterator *)local_50,&local_d8);
  boost::detail::test_impl
            ("where == data.begin()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x5b6,"void erase_suite::erase_range_wstring()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  v_00 = trial::dynamic::operator==
                   ((basic_variable<std::allocator<char>_> *)
                    &where.
                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     .current.current,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("data == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x5b7,"void erase_suite::erase_range_wstring()",v_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void erase_range_wstring()
{
    variable data(L"bravo");
    auto where = data.erase(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST(where == data.begin());
    TRIAL_PROTOCOL_TEST(data == L"bravo");
}